

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O3

void place_branch(level *lev,branch *br,xchar x,xchar y)

{
  d_level *lev1;
  branch *pbVar1;
  boolean bVar2;
  uint uVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  d_level *src;
  mkroom *croom;
  coord m;
  coord local_42;
  d_level *local_40;
  branch *local_38;
  
  if (br == (branch *)0x0) {
    return;
  }
  if ((made_branch & 1) != 0) {
    return;
  }
  iVar6 = lev->nroom;
  local_38 = br;
  if (x == '\0') {
    if (iVar6 != 0) {
      if (iVar6 < 3) {
        uVar7 = mt_random();
        croom = lev->rooms + SUB168(ZEXT416(uVar7) % SEXT816((long)iVar6),0);
      }
      else {
        uVar7 = 0;
        while( true ) {
          uVar3 = mt_random();
          croom = lev->rooms + SUB168(ZEXT416(uVar3) % SEXT816((long)iVar6),0);
          if ((((croom != lev->dnstairs_room) && (croom != lev->upstairs_room)) &&
              (croom->rtype == '\0')) || (0x62 < uVar7)) break;
          uVar7 = uVar7 + 1;
          iVar6 = lev->nroom;
        }
      }
      do {
        bVar2 = somexy(lev,croom,&local_42);
        if (bVar2 == '\0') {
          impossible("Can\'t place branch!");
        }
        bVar2 = occupied(lev,local_42.x,local_42.y);
      } while ((bVar2 != '\0') ||
              (x = local_42.x, y = local_42.y,
              (lev->locations[local_42.x][local_42.y].typ & 0xfeU) != 0x18));
      goto LAB_001d9ca3;
    }
    mazexy(lev,&local_42);
    x = local_42.x;
    y = local_42.y;
  }
  else if (0 < iVar6) {
    croom = lev->rooms;
    local_40 = (d_level *)CONCAT44(local_40._4_4_,(int)x);
    iVar6 = 0;
    do {
      bVar2 = inside_room(croom,(xchar)local_40,y);
      if (bVar2 != '\0') goto LAB_001d9ca3;
      croom = croom + 1;
      iVar6 = iVar6 + 1;
    } while (iVar6 < lev->nroom);
  }
  croom = (mkroom *)0x0;
LAB_001d9ca3:
  pbVar1 = local_38;
  lev1 = &local_38->end1;
  local_40 = &lev->z;
  bVar2 = on_level(lev1,local_40);
  iVar6 = pbVar1->type;
  src = &pbVar1->end2;
  if (bVar2 == '\0') {
    src = lev1;
  }
  if (iVar6 == 3) {
    mkportal(lev,x,y,src->dnum,src->dlevel);
  }
  else if (iVar6 != (bVar2 == '\0') + 1) {
    (lev->sstairs).sx = x;
    (lev->sstairs).sy = y;
    bVar2 = on_level(lev1,local_40);
    cVar4 = (char)*(undefined4 *)&local_38->end1_up;
    cVar5 = cVar4 == '\0';
    if (bVar2 != '\0') {
      cVar5 = cVar4;
    }
    (lev->sstairs).up = cVar5;
    assign_level(&(lev->sstairs).tolev,src);
    lev->sstairs_room = croom;
    *(uint *)&lev->locations[x][y].field_0x6 =
         (uint)((lev->sstairs).up == '\0') * 0x10 +
         (*(uint *)&lev->locations[x][y].field_0x6 & 0xfffffe0f) + 0x10;
    lev->locations[x][y].typ = '\x1a';
  }
  made_branch = 1;
  return;
}

Assistant:

void place_branch(struct level *lev,
		  branch *br,		/* branch to place */
		  xchar x,  xchar y)	/* location */
{
	coord	      m;
	d_level	      *dest;
	boolean	      make_stairs;
	struct mkroom *br_room;

	/*
	 * Return immediately if there is no branch to make or we have
	 * already made one.  This routine can be called twice when
	 * a special level is loaded that specifies an SSTAIR location
	 * as a favored spot for a branch.
	 */
	if (!br || made_branch) return;

	if (!x) {	/* find random coordinates for branch */
	    br_room = find_branch_room(lev, &m);
	    x = m.x;
	    y = m.y;
	} else {
	    br_room = pos_to_room(lev, x, y);
	}

	if (on_level(&br->end1, &lev->z)) {
	    /* we're on end1 */
	    make_stairs = br->type != BR_NO_END1;
	    dest = &br->end2;
	} else {
	    /* we're on end2 */
	    make_stairs = br->type != BR_NO_END2;
	    dest = &br->end1;
	}

	if (br->type == BR_PORTAL) {
	    mkportal(lev, x, y, dest->dnum, dest->dlevel);
	} else if (make_stairs) {
	    lev->sstairs.sx = x;
	    lev->sstairs.sy = y;
	    lev->sstairs.up = (char) on_level(&br->end1, &lev->z) ?
					    br->end1_up : !br->end1_up;
	    assign_level(&lev->sstairs.tolev, dest);
	    lev->sstairs_room = br_room;

	    lev->locations[x][y].ladder = lev->sstairs.up ? LA_UP : LA_DOWN;
	    lev->locations[x][y].typ = STAIRS;
	}
	/*
	 * Set made_branch to TRUE even if we didn't make a stairwell (i.e.
	 * make_stairs is false) since there is currently only one branch
	 * per level, if we failed once, we're going to fail again on the
	 * next call.
	 */
	made_branch = TRUE;
}